

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

uint8_t * google::protobuf::internal::WireFormat::InternalSerializeMessageSetItem
                    (FieldDescriptor *field,Message *message,uint8_t *target,
                    EpsCopyOutputStream *stream)

{
  uint32_t value;
  Reflection *this;
  uint8_t *puVar1;
  Message *value_00;
  Reflection *message_reflection;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  Message *message_local;
  FieldDescriptor *field_local;
  
  this = Message::GetReflection(message);
  puVar1 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
  puVar1 = io::CodedOutputStream::WriteVarint32ToArray(0xb,puVar1);
  value = FieldDescriptor::number(field);
  puVar1 = WireFormatLite::WriteUInt32ToArray(2,value,puVar1);
  value_00 = Reflection::GetMessage(this,message,field,(MessageFactory *)0x0);
  puVar1 = WireFormatLite::InternalWriteMessage<google::protobuf::Message>(3,value_00,puVar1,stream)
  ;
  puVar1 = io::EpsCopyOutputStream::EnsureSpace(stream,puVar1);
  puVar1 = io::CodedOutputStream::WriteVarint32ToArray(0xc,puVar1);
  return puVar1;
}

Assistant:

uint8_t* WireFormat::InternalSerializeMessageSetItem(
    const FieldDescriptor* field, const Message& message, uint8_t* target,
    io::EpsCopyOutputStream* stream) {
  const Reflection* message_reflection = message.GetReflection();

  target = stream->EnsureSpace(target);
  // Start group.
  target = io::CodedOutputStream::WriteTagToArray(
      WireFormatLite::kMessageSetItemStartTag, target);
  // Write type ID.
  target = WireFormatLite::WriteUInt32ToArray(
      WireFormatLite::kMessageSetTypeIdNumber, field->number(), target);
  // Write message.
  target = WireFormatLite::InternalWriteMessage(
      WireFormatLite::kMessageSetMessageNumber,
      message_reflection->GetMessage(message, field), target, stream);
  // End group.
  target = stream->EnsureSpace(target);
  target = io::CodedOutputStream::WriteTagToArray(
      WireFormatLite::kMessageSetItemEndTag, target);
  return target;
}